

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O1

int run_test_udp_connect(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  bool bVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_udp_recv_cb p_Var6;
  uv_handle_t *puVar7;
  uv_udp_t *puVar8;
  uv_udp_send_t *req_00;
  int64_t eval_b_8;
  int64_t eval_b_22;
  sockaddr_in ext_addr;
  int addrlen;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  code *pcStack_1e8;
  undefined8 uStack_1d8;
  uv_close_cb p_Stack_1d0;
  uv_loop_t *puStack_1c8;
  uv_handle_t *puStack_1b8;
  undefined1 auStack_1b0 [32];
  uv_udp_recv_cb p_Stack_190;
  undefined1 local_188 [8];
  uv_loop_t *local_180;
  uv__queue *local_178 [2];
  int local_164;
  sockaddr_in local_160;
  uv_udp_send_t local_150;
  long lVar5;
  
  puVar8 = (uv_udp_t *)local_188;
  p_Stack_190 = (uv_udp_recv_cb)0x1d634c;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  local_150.data = (void *)(long)iVar1;
  local_178[0] = (uv__queue *)0x0;
  if ((uv__queue *)local_150.data == (uv__queue *)0x0) {
    p_Stack_190 = (uv_udp_recv_cb)0x1d6371;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6380;
    iVar1 = uv_udp_init(puVar3,&server);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d699c;
    p_Stack_190 = (uv_udp_recv_cb)0x1d63b5;
    iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d69ab;
    p_Stack_190 = (uv_udp_recv_cb)0x1d63ef;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d69ba;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6414;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6423;
    iVar1 = uv_udp_init(puVar3,&client);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d69c9;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6454;
    buf = uv_buf_init("EXIT",4);
    p_Stack_190 = (uv_udp_recv_cb)0x1d6478;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_160);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d69d8;
    p_Stack_190 = (uv_udp_recv_cb)0x1d64a9;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&local_160);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d69e7;
    p_Stack_190 = (uv_udp_recv_cb)0x1d64d7;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d69f6;
    p_Stack_190 = (uv_udp_recv_cb)0x1d650d;
    iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,(sockaddr_in *)local_178);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6a05;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6543;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6a12;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6574;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6a1f;
    p_Stack_190 = (uv_udp_recv_cb)0x1d65a3;
    iVar1 = uv_udp_connect(&client,(sockaddr *)local_178);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff96;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff96) goto LAB_001d6a2c;
    local_164 = 0x10;
    p_Stack_190 = (uv_udp_recv_cb)0x1d65dd;
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)&local_160,&local_164);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6a39;
    p_Stack_190 = (uv_udp_recv_cb)0x1d661a;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff96;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff96) goto LAB_001d6a46;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6652;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    local_150.data = (uv__queue *)0x4;
    local_188 = (undefined1  [8])(long)iVar1;
    if (local_188 != (undefined1  [8])0x4) goto LAB_001d6a53;
    p_Stack_190 = (uv_udp_recv_cb)0x1d668d;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)local_178);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff96;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff96) goto LAB_001d6a60;
    p_Stack_190 = (uv_udp_recv_cb)0x1d66b9;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6a6d;
    p_Stack_190 = (uv_udp_recv_cb)0x1d66e5;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff95;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff95) goto LAB_001d6a7a;
    local_164 = 0x10;
    p_Stack_190 = (uv_udp_recv_cb)0x1d671f;
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)&local_160,&local_164);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff95;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff95) goto LAB_001d6a87;
    p_Stack_190 = (uv_udp_recv_cb)0x1d675c;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    local_150.data = (uv__queue *)0x4;
    local_188 = (undefined1  [8])(long)iVar1;
    if (local_188 != (undefined1  [8])0x4) goto LAB_001d6a94;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6794;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffffa7;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffffa7) goto LAB_001d6aa1;
    p_Stack_190 = (uv_udp_recv_cb)0x1d67c5;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6aae;
    p_Stack_190 = (uv_udp_recv_cb)0x1d680e;
    iVar1 = uv_udp_send(&local_150,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
    local_188 = (undefined1  [8])(long)iVar1;
    local_180 = (uv_loop_t *)0xffffffffffffff96;
    if (local_188 != (undefined1  [8])0xffffffffffffff96) goto LAB_001d6abb;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6853;
    iVar1 = uv_udp_send(&local_150,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    local_188 = (undefined1  [8])(long)iVar1;
    local_180 = (uv_loop_t *)0x0;
    if (local_188 != (undefined1  [8])0x0) goto LAB_001d6ac8;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6876;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6880;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_188 = (undefined1  [8])0x2;
    local_180 = (uv_loop_t *)(long)close_cb_called;
    if (local_180 != (uv_loop_t *)0x2) goto LAB_001d6ad5;
    local_188 = (undefined1  [8])0x4;
    local_180 = (uv_loop_t *)(long)sv_recv_cb_called;
    if (local_180 != (uv_loop_t *)0x4) goto LAB_001d6ae2;
    local_188 = (undefined1  [8])0x2;
    local_180 = (uv_loop_t *)(long)cl_send_cb_called;
    if (local_180 != (uv_loop_t *)0x2) goto LAB_001d6aef;
    local_188 = (undefined1  [8])client.send_queue_size;
    local_180 = (uv_loop_t *)0x0;
    if (client.send_queue_size != 0) goto LAB_001d6afc;
    local_188 = (undefined1  [8])server.send_queue_size;
    local_180 = (uv_loop_t *)0x0;
    if (server.send_queue_size != 0) goto LAB_001d6b09;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6934;
    unaff_RBX = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6948;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    p_Stack_190 = (uv_udp_recv_cb)0x1d6952;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_188 = (undefined1  [8])0x0;
    p_Stack_190 = (uv_udp_recv_cb)0x1d695f;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6967;
    iVar1 = uv_loop_close(puVar3);
    local_180 = (uv_loop_t *)(long)iVar1;
    if (local_188 == (undefined1  [8])local_180) {
      p_Stack_190 = (uv_udp_recv_cb)0x1d6982;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    p_Stack_190 = (uv_udp_recv_cb)0x1d699c;
    run_test_udp_connect_cold_1();
LAB_001d699c:
    p_Stack_190 = (uv_udp_recv_cb)0x1d69ab;
    run_test_udp_connect_cold_2();
LAB_001d69ab:
    p_Stack_190 = (uv_udp_recv_cb)0x1d69ba;
    run_test_udp_connect_cold_3();
LAB_001d69ba:
    p_Stack_190 = (uv_udp_recv_cb)0x1d69c9;
    run_test_udp_connect_cold_4();
LAB_001d69c9:
    p_Stack_190 = (uv_udp_recv_cb)0x1d69d8;
    run_test_udp_connect_cold_5();
LAB_001d69d8:
    p_Stack_190 = (uv_udp_recv_cb)0x1d69e7;
    run_test_udp_connect_cold_6();
LAB_001d69e7:
    p_Stack_190 = (uv_udp_recv_cb)0x1d69f6;
    run_test_udp_connect_cold_7();
LAB_001d69f6:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a05;
    run_test_udp_connect_cold_8();
LAB_001d6a05:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a12;
    run_test_udp_connect_cold_9();
LAB_001d6a12:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a1f;
    run_test_udp_connect_cold_10();
LAB_001d6a1f:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a2c;
    run_test_udp_connect_cold_11();
LAB_001d6a2c:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a39;
    run_test_udp_connect_cold_12();
LAB_001d6a39:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a46;
    run_test_udp_connect_cold_13();
LAB_001d6a46:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a53;
    run_test_udp_connect_cold_14();
LAB_001d6a53:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a60;
    run_test_udp_connect_cold_15();
LAB_001d6a60:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a6d;
    run_test_udp_connect_cold_16();
LAB_001d6a6d:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a7a;
    run_test_udp_connect_cold_17();
LAB_001d6a7a:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a87;
    run_test_udp_connect_cold_18();
LAB_001d6a87:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a94;
    run_test_udp_connect_cold_19();
LAB_001d6a94:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6aa1;
    run_test_udp_connect_cold_20();
LAB_001d6aa1:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6aae;
    run_test_udp_connect_cold_21();
LAB_001d6aae:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6abb;
    run_test_udp_connect_cold_22();
LAB_001d6abb:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ac8;
    run_test_udp_connect_cold_23();
LAB_001d6ac8:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ad5;
    run_test_udp_connect_cold_24();
LAB_001d6ad5:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ae2;
    run_test_udp_connect_cold_25();
LAB_001d6ae2:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6aef;
    run_test_udp_connect_cold_26();
LAB_001d6aef:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6afc;
    run_test_udp_connect_cold_27();
LAB_001d6afc:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6b09;
    run_test_udp_connect_cold_28();
LAB_001d6b09:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6b16;
    run_test_udp_connect_cold_29();
  }
  p_Var6 = (uv_udp_recv_cb)(local_188 + 8);
  p_Stack_190 = alloc_cb;
  run_test_udp_connect_cold_30();
  bVar4 = puVar8 == &client || puVar8 == &server;
  lVar5 = CONCAT71(0xfb6e,bVar4);
  p_Stack_190 = (uv_udp_recv_cb)(ulong)bVar4;
  auStack_1b0._24_8_ = (uv_alloc_cb)0x0;
  if (p_Stack_190 == (uv_udp_recv_cb)0x0) {
    auStack_1b0._8_8_ = (uv_loop_t *)0x1d6ba0;
    alloc_cb_cold_2();
  }
  else {
    auStack_1b0._24_8_ = (uv_alloc_cb)0x10000;
    p_Stack_190 = p_Var6;
    if ((long)p_Var6 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0xfb6f60;
    }
  }
  puVar7 = (uv_handle_t *)(auStack_1b0 + 0x18);
  auStack_1b0._8_8_ = sv_recv_cb;
  alloc_cb_cold_1();
  iVar2 = (int)&puStack_1b8;
  iVar1 = extraout_EAX;
  if ((long)puVar7 < 1) {
LAB_001d6c46:
    return iVar1;
  }
  auStack_1b0._0_8_ = (uv__queue *)0x4;
  puStack_1b8 = puVar7;
  auStack_1b0._8_8_ = unaff_RBX;
  if (puVar7 == (uv_handle_t *)0x4) {
    if (lVar5 == 0) goto LAB_001d6c59;
    iVar1 = memcmp("EXIT",(void *)*extraout_RDX_00,4);
    auStack_1b0._0_8_ = SEXT48(iVar1);
    puStack_1b8 = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_1b0._0_8_ == (uv__queue *)0x0) {
      iVar1 = sv_recv_cb_called + 1;
      sv_recv_cb_called = iVar1;
      if (iVar1 == 4) {
        uv_close((uv_handle_t *)&server,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_001d6c46;
    }
  }
  else {
    sv_recv_cb_cold_1();
LAB_001d6c59:
    sv_recv_cb_cold_3();
  }
  req_00 = (uv_udp_send_t *)auStack_1b0;
  sv_recv_cb_cold_2();
  puStack_1c8 = unaff_RBX;
  if (req_00 == (uv_udp_send_t *)0x0) {
    pcStack_1e8 = (code *)0x1d6d97;
    cl_send_cb_cold_5();
LAB_001d6d97:
    pcStack_1e8 = (code *)0x1d6da6;
    cl_send_cb_cold_1();
LAB_001d6da6:
    pcStack_1e8 = (code *)0x1d6db5;
    cl_send_cb_cold_4();
  }
  else {
    p_Stack_1d0 = (uv_close_cb)(long)iVar2;
    uStack_1d8._0_4_ = UV_UNKNOWN_HANDLE;
    uStack_1d8._4_4_ = 0;
    if (p_Stack_1d0 != (uv_close_cb)0x0) goto LAB_001d6d97;
    p_Stack_1d0 = (uv_close_cb)(ulong)(req_00->handle == &client || req_00->handle == &server);
    uStack_1d8._0_4_ = UV_UNKNOWN_HANDLE;
    uStack_1d8._4_4_ = 0;
    if (p_Stack_1d0 == (uv_close_cb)0x0) goto LAB_001d6da6;
    iVar1 = cl_send_cb_called + 1;
    iVar2 = cl_send_cb_called;
    if (cl_send_cb_called != 0) {
LAB_001d6d8a:
      cl_send_cb_called = iVar1;
      return iVar2;
    }
    pcStack_1e8 = (code *)0x1d6d08;
    cl_send_cb_called = cl_send_cb_called + 1;
    uv_udp_connect(&client,(sockaddr *)0x0);
    pcStack_1e8 = (code *)0x1d6d29;
    iVar1 = uv_udp_send(req_00,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    p_Stack_1d0 = (uv_close_cb)(long)iVar1;
    uStack_1d8._0_4_ = 0xffffffa7;
    uStack_1d8._4_4_ = 0xffffffff;
    if (p_Stack_1d0 == (uv_close_cb)0xffffffffffffffa7) {
      pcStack_1e8 = (code *)0x1d6d6e;
      iVar2 = uv_udp_send(req_00,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
      p_Stack_1d0 = (uv_close_cb)(long)iVar2;
      uStack_1d8._0_4_ = UV_UNKNOWN_HANDLE;
      uStack_1d8._4_4_ = 0;
      iVar1 = cl_send_cb_called;
      if (p_Stack_1d0 == (uv_close_cb)0x0) goto LAB_001d6d8a;
      goto LAB_001d6dc4;
    }
  }
  pcStack_1e8 = (code *)0x1d6dc4;
  cl_send_cb_cold_2();
LAB_001d6dc4:
  puVar8 = (uv_udp_t *)&p_Stack_1d0;
  pcStack_1e8 = close_cb;
  cl_send_cb_cold_3();
  pcStack_1e8 = (code *)(ulong)(puVar8 == &client || puVar8 == &server);
  if (pcStack_1e8 == (code *)0x0) {
    puVar8 = (uv_udp_t *)&pcStack_1e8;
    close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_closing((uv_handle_t *)puVar8);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return iVar1;
    }
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar8);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar8,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows with WSAEADDRNOTAVAIL */
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
#endif

  ASSERT_OK(uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_OK(r);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_EQ(r, UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(r, UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(4, sv_recv_cb_called);
  ASSERT_EQ(2, cl_send_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}